

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen_prepare.cpp
# Opt level: O3

void __thiscall mocker::CodegenPreparation::sortBlocks(CodegenPreparation *this)

{
  __node_base_ptr *pp_Var1;
  FunctionModule *pFVar2;
  _Hash_node_base *p_Var3;
  _List_node_base *p_Var4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  undefined8 uVar5;
  bool bVar6;
  BasicBlock *pBVar7;
  BasicBlock *pBVar8;
  ulong *puVar9;
  _Node *p_Var10;
  size_t __bkt;
  BasicBlockList *pBVar11;
  ulong uVar12;
  _Hash_node_base *p_Var13;
  LoopInfo *this_02;
  _List_node_base *p_Var14;
  __hash_code __code;
  _Hash_node_base *p_Var15;
  iterator __end1;
  ulong *puVar16;
  iterator __begin1;
  ulong *puVar17;
  undefined8 uVar18;
  size_t nxt;
  vector<unsigned_long,_std::allocator<unsigned_long>_> order;
  BasicBlockList newBBs;
  vector<unsigned_long,_std::allocator<unsigned_long>_> PreOrder;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  visited;
  _List_node_base *local_e0;
  _Any_data local_d8;
  code *local_c8;
  code *local_c0;
  _List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_> local_b0;
  ulong *local_98;
  ulong *puStack_90;
  long local_88;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_78;
  LoopInfo *local_40;
  ulong *local_38;
  
  this_02 = &this->loopTree;
  LoopInfo::init(this_02,(EVP_PKEY_CTX *)(this->super_FuncPass).func);
  pFVar2 = (this->super_FuncPass).func;
  local_88 = 0;
  local_98 = (ulong *)0x0;
  puStack_90 = (ulong *)0x0;
  pp_Var1 = &local_78._M_single_bucket;
  local_78._M_bucket_count = 1;
  local_78._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_78._M_element_count = 0;
  local_78._M_rehash_policy._M_max_load_factor = 1.0;
  local_78._M_rehash_policy._M_next_resize = 0;
  local_78._M_single_bucket = (__node_base_ptr)0x0;
  local_d8._8_8_ = 0;
  local_78._M_buckets = pp_Var1;
  local_d8._M_unused._M_object = operator_new(0x20);
  *(ulong ***)local_d8._M_unused._0_8_ = &local_98;
  *(FunctionModule **)((long)local_d8._M_unused._0_8_ + 8) = pFVar2;
  *(_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    **)((long)local_d8._M_unused._0_8_ + 0x10) = &local_78;
  *(_Any_data **)((long)local_d8._M_unused._0_8_ + 0x18) = &local_d8;
  local_c0 = std::
             _Function_handler<void_(unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/optim/codegen_prepare.cpp:25:42)>
             ::_M_invoke;
  local_c8 = std::
             _Function_handler<void_(unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/optim/codegen_prepare.cpp:25:42)>
             ::_M_manager;
  local_b0._M_impl._M_node.super__List_node_base._M_next =
       (pFVar2->bbs).
       super__List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>._M_impl.
       _M_node.super__List_node_base._M_next[1]._M_next;
  std::
  _Function_handler<void_(unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/optim/codegen_prepare.cpp:25:42)>
  ::_M_invoke(&local_d8,(unsigned_long *)&local_b0);
  if (local_c8 != (code *)0x0) {
    (*local_c8)(&local_d8,&local_d8,3);
  }
  std::
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_78);
  local_78._M_bucket_count = 1;
  local_78._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_78._M_element_count = 0;
  local_78._M_rehash_policy._M_max_load_factor = 1.0;
  local_78._M_rehash_policy._M_next_resize = 0;
  local_78._M_single_bucket = (__node_base_ptr)0x0;
  local_d8._M_unused._M_object = (unsigned_long *)0x0;
  local_d8._8_8_ = (_func_void *)0x0;
  local_c8 = (code *)0x0;
  puVar9 = local_98;
  local_78._M_buckets = pp_Var1;
  if (local_98 != puStack_90) {
    local_38 = puStack_90;
    puVar16 = local_98;
    puVar17 = puStack_90;
    local_40 = this_02;
    do {
      local_b0._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)*puVar16;
      uVar12 = (ulong)local_b0._M_impl._M_node.super__List_node_base._M_next %
               local_78._M_bucket_count;
      if (local_78._M_buckets[uVar12] != (__node_base_ptr)0x0) {
        p_Var3 = local_78._M_buckets[uVar12]->_M_nxt;
        p_Var4 = (_List_node_base *)p_Var3[1]._M_nxt;
        p_Var13 = p_Var3;
        p_Var14 = p_Var4;
        while (local_b0._M_impl._M_node.super__List_node_base._M_next != p_Var14) {
          p_Var13 = p_Var13->_M_nxt;
          if ((p_Var13 == (_Hash_node_base *)0x0) ||
             (p_Var14 = (_List_node_base *)p_Var13[1]._M_nxt,
             (ulong)p_Var14 % local_78._M_bucket_count != uVar12)) goto joined_r0x00158812;
        }
        if (*(_List_node_base **)(local_d8._8_8_ + -8) !=
            local_b0._M_impl._M_node.super__List_node_base._M_next) goto LAB_00158adc;
joined_r0x00158812:
        do {
          if (local_b0._M_impl._M_node.super__List_node_base._M_next == p_Var4) goto LAB_00158871;
          p_Var3 = p_Var3->_M_nxt;
        } while ((p_Var3 != (_Hash_node_base *)0x0) &&
                (p_Var4 = (_List_node_base *)p_Var3[1]._M_nxt,
                (ulong)p_Var4 % local_78._M_bucket_count == uVar12));
      }
      if ((code *)local_d8._8_8_ == local_c8) {
        std::vector<unsigned_long,std::allocator<unsigned_long>>::_M_realloc_insert<unsigned_long&>
                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)local_d8._M_pod_data,
                   (iterator)local_d8._8_8_,(unsigned_long *)&local_b0);
      }
      else {
        *(_List_node_base **)local_d8._8_8_ = local_b0._M_impl._M_node.super__List_node_base._M_next
        ;
        local_d8._8_8_ = local_d8._8_8_ + 8;
      }
      std::
      _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::_M_emplace<unsigned_long&>
                ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)&local_78,&local_b0);
LAB_00158871:
      pBVar7 = ir::FunctionModule::getBasicBlock
                         ((this->super_FuncPass).func,
                          (size_t)local_b0._M_impl._M_node.super__List_node_base._M_next);
      p_Var14 = (pBVar7->insts).
                super__List_base<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
                ._M_impl._M_node.super__List_node_base._M_prev;
      p_Var4 = p_Var14[1]._M_next;
      if (*(int *)&p_Var4->_M_prev == 0xb) {
        this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var14[1]._M_prev;
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            this_00->_M_use_count = this_00->_M_use_count + 1;
            UNLOCK();
          }
          else {
            this_00->_M_use_count = this_00->_M_use_count + 1;
          }
        }
        bVar6 = LoopInfo::isLoopHeader
                          (this_02,(size_t)local_b0._M_impl._M_node.super__List_node_base._M_next);
        if (bVar6) {
          local_e0 = (p_Var4[2]._M_prev)->_M_prev;
          if ((code *)local_d8._8_8_ == local_c8) {
            std::vector<unsigned_long,std::allocator<unsigned_long>>::
            _M_realloc_insert<unsigned_long&>
                      ((vector<unsigned_long,std::allocator<unsigned_long>> *)local_d8._M_pod_data,
                       (iterator)local_d8._8_8_,(unsigned_long *)&local_e0);
          }
          else {
            *(_List_node_base **)local_d8._8_8_ = local_e0;
            local_d8._8_8_ = local_d8._8_8_ + 8;
          }
          std::
          _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::_M_emplace<unsigned_long&>
                    ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      *)&local_78,&local_e0);
        }
        else {
          pBVar7 = ir::FunctionModule::getBasicBlock
                             ((this->super_FuncPass).func,(size_t)(p_Var4[2]._M_prev)->_M_prev);
          pBVar8 = ir::FunctionModule::getBasicBlock
                             ((this->super_FuncPass).func,(size_t)(p_Var4[3]._M_prev)->_M_prev);
          p_Var14 = (pBVar7->insts).
                    super__List_base<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
                    ._M_impl._M_node.super__List_node_base._M_prev;
          if (*(int *)&(p_Var14[1]._M_next)->_M_prev == 0xd) {
            this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var14[1]._M_prev;
            if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                this_01->_M_use_count = this_01->_M_use_count + 1;
                UNLOCK();
              }
              else {
                this_01->_M_use_count = this_01->_M_use_count + 1;
              }
            }
            p_Var3 = (_Hash_node_base *)pBVar8->labelID;
            p_Var13 = (_Hash_node_base *)0x0;
            if ((local_78._M_buckets[(ulong)p_Var3 % local_78._M_bucket_count] !=
                 (__node_base_ptr)0x0) &&
               (p_Var15 = local_78._M_buckets[(ulong)p_Var3 % local_78._M_bucket_count]->_M_nxt,
               p_Var13 = p_Var15, p_Var3 != p_Var15[1]._M_nxt)) {
              while (p_Var15 = p_Var15->_M_nxt, p_Var15 != (_Hash_node_base *)0x0) {
                p_Var13 = (_Hash_node_base *)0x0;
                if (((ulong)p_Var15[1]._M_nxt % local_78._M_bucket_count !=
                     (ulong)p_Var3 % local_78._M_bucket_count) ||
                   (p_Var13 = p_Var15, p_Var3 == p_Var15[1]._M_nxt)) goto LAB_001589c2;
              }
              p_Var13 = (_Hash_node_base *)0x0;
            }
LAB_001589c2:
            if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
            }
            this_02 = local_40;
            if (p_Var13 == (_Hash_node_base *)0x0) {
              local_e0 = (_List_node_base *)pBVar8->labelID;
              if ((code *)local_d8._8_8_ == local_c8) {
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                _M_realloc_insert<unsigned_long>
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_d8,
                           (iterator)local_d8._8_8_,(unsigned_long *)&local_e0);
              }
              else {
                *(_List_node_base **)local_d8._8_8_ = local_e0;
                local_d8._8_8_ = local_d8._8_8_ + 8;
              }
              local_e0 = (_List_node_base *)pBVar8->labelID;
              std::
              _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::_M_emplace<unsigned_long>(&local_78,&local_e0);
              goto LAB_00158ac7;
            }
          }
          p_Var14 = (_List_node_base *)pBVar7->labelID;
          if (local_78._M_buckets[(ulong)p_Var14 % local_78._M_bucket_count] != (__node_base_ptr)0x0
             ) {
            p_Var3 = local_78._M_buckets[(ulong)p_Var14 % local_78._M_bucket_count]->_M_nxt;
            p_Var4 = (_List_node_base *)p_Var3[1]._M_nxt;
            do {
              if (p_Var14 == p_Var4) goto LAB_00158ac7;
              p_Var3 = p_Var3->_M_nxt;
            } while ((p_Var3 != (_Hash_node_base *)0x0) &&
                    (p_Var4 = (_List_node_base *)p_Var3[1]._M_nxt,
                    (ulong)p_Var4 % local_78._M_bucket_count ==
                    (ulong)p_Var14 % local_78._M_bucket_count));
          }
          if ((code *)local_d8._8_8_ == local_c8) {
            local_e0 = p_Var14;
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
            _M_realloc_insert<unsigned_long>
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_d8,
                       (iterator)local_d8._8_8_,(unsigned_long *)&local_e0);
          }
          else {
            *(_List_node_base **)local_d8._8_8_ = p_Var14;
            local_d8._8_8_ = local_d8._8_8_ + 8;
          }
          local_e0 = (_List_node_base *)pBVar7->labelID;
          std::
          _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::_M_emplace<unsigned_long>(&local_78,&local_e0);
        }
LAB_00158ac7:
        puVar17 = local_38;
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        }
      }
LAB_00158adc:
      puVar16 = puVar16 + 1;
      puVar9 = puStack_90;
    } while (puVar16 != puVar17);
  }
  uVar5 = local_d8._8_8_;
  if (local_d8._8_8_ - local_d8._0_8_ != (long)puVar9 - (long)local_98) {
    __assert_fail("order.size() == PreOrder.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/optim/codegen_prepare.cpp"
                  ,0x5e,"void mocker::CodegenPreparation::sortBlocks()");
  }
  local_b0._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_b0;
  local_b0._M_impl._M_node._M_size = 0;
  local_b0._M_impl._M_node.super__List_node_base._M_prev =
       local_b0._M_impl._M_node.super__List_node_base._M_next;
  if (local_d8._M_unused._M_object != (void *)local_d8._8_8_) {
    uVar18 = local_d8._M_unused._0_8_;
    do {
      pBVar11 = &((this->super_FuncPass).func)->bbs;
      p_Var14 = (_List_node_base *)pBVar11;
      do {
        p_Var14 = (((_List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_> *)
                   &p_Var14->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
        if (p_Var14 == (_List_node_base *)pBVar11) goto LAB_00158b74;
      } while (p_Var14[1]._M_next != (_List_node_base *)*(unsigned_long *)uVar18);
      p_Var10 = std::__cxx11::list<mocker::ir::BasicBlock,std::allocator<mocker::ir::BasicBlock>>::
                _M_create_node<mocker::ir::BasicBlock_const&>
                          ((list<mocker::ir::BasicBlock,std::allocator<mocker::ir::BasicBlock>> *)
                           &local_b0,(BasicBlock *)(p_Var14 + 1));
      std::__detail::_List_node_base::_M_hook(&p_Var10->super__List_node_base);
      local_b0._M_impl._M_node._M_size = local_b0._M_impl._M_node._M_size + 1;
LAB_00158b74:
      uVar18 = uVar18 + 8;
    } while (uVar18 != uVar5);
  }
  std::__cxx11::list<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>::
  _M_move_assign(&((this->super_FuncPass).func)->bbs,&local_b0);
  std::__cxx11::_List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>::
  _M_clear(&local_b0);
  if ((_func_void *)local_d8._M_unused._0_8_ != (_func_void *)0x0) {
    operator_delete(local_d8._M_unused._M_object,(long)local_c8 - local_d8._0_8_);
  }
  std::
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_78);
  if (local_98 != (ulong *)0x0) {
    operator_delete(local_98,local_88 - (long)local_98);
  }
  return;
}

Assistant:

void CodegenPreparation::sortBlocks() {
  loopTree.init(func);

  const auto PreOrder = getPreOrder(func);

  std::unordered_set<std::size_t> visited;
  std::vector<std::size_t> order;
  for (auto n : PreOrder) {
    if (isIn(visited, n) && order.back() != n) // can not be scheduled
      continue;

    if (!isIn(visited, n)) {
      order.emplace_back(n);
      visited.emplace(n);
    }

    auto br = ir::dyc<ir::Branch>(func.getBasicBlock(n).getInsts().back());
    if (!br) {
      continue;
    }

    if (loopTree.isLoopHeader(n)) {
      auto nxt = br->getThen()->getID();
      order.emplace_back(nxt);
      visited.emplace(nxt);
      continue;
    }

    auto &thenBB = func.getBasicBlock(br->getThen()->getID());
    auto &elseBB = func.getBasicBlock(br->getElse()->getID());
    if (ir::dyc<ir::Ret>(thenBB.getInsts().back()) &&
        !isIn(visited, elseBB.getLabelID())) {
      order.emplace_back(elseBB.getLabelID());
      visited.emplace(elseBB.getLabelID());
    } else if (!isIn(visited, thenBB.getLabelID())) {
      order.emplace_back(thenBB.getLabelID());
      visited.emplace(thenBB.getLabelID());
    }
  }

  assert(order.size() == PreOrder.size());

  ir::BasicBlockList newBBs;
  for (auto cur : order) {
    for (auto &bb : func.getBBs()) {
      if (bb.getLabelID() != cur)
        continue;
      newBBs.emplace_back(bb);
      break;
    }
  }
  func.getMutableBBs() = std::move(newBBs);
}